

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  size_t sVar1;
  anon_class_24_3_5f4cc63d local_30;
  bool local_12;
  bool local_11;
  bool emitted;
  CompilerMSL *pCStack_10;
  bool fully_inlined;
  CompilerMSL *this_local;
  
  pCStack_10 = this;
  sVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::size
                    (&(this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  local_11 = sVar1 == 1;
  local_12 = false;
  local_30.fully_inlined = &local_11;
  local_30.emitted = &local_12;
  local_30.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRConstant,spirv_cross::CompilerMSL::declare_constant_arrays()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_30);
  if ((local_12 & 1U) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
  }
  return;
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (is_array(type) && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement(inject_top_level_storage_qualifier(variable_decl(type, name), "constant"),
			          " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}